

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_waitable_timer.hpp
# Opt level: O2

void __thiscall
asio::
basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
::initiate_async_wait::operator()
          (initiate_async_wait *this,
          _Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
          *handler)

{
  undefined8 *puVar1;
  non_const_lvalue<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>_>
  handler2;
  
  puVar1 = *(undefined8 **)this;
  detail::
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
  ::
  async_wait<std::_Bind<void(nuraft::asio_service_impl::*(nuraft::asio_service_impl*,std::_Placeholder<1>))(std::error_code)>,asio::any_io_executor>
            ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
              *)*puVar1,(implementation_type *)(puVar1 + 1),handler,(any_io_executor *)(puVar1 + 8))
  ;
  return;
}

Assistant:

void operator()(ASIO_MOVE_ARG(WaitHandler) handler) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a WaitHandler.
      ASIO_WAIT_HANDLER_CHECK(WaitHandler, handler) type_check;

      detail::non_const_lvalue<WaitHandler> handler2(handler);
      self_->impl_.get_service().async_wait(
          self_->impl_.get_implementation(),
          handler2.value, self_->impl_.get_executor());
    }